

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver_tests.cpp
# Opt level: O2

void __thiscall httpserver_tests::test_query_parameters::test_method(test_query_parameters *this)

{
  long lVar1;
  _Alloc_hider _Var2;
  iterator in_R8;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar6;
  char *pcVar5;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  allocator<char> local_121;
  assertion_result local_120;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  undefined1 local_80 [24];
  char *local_68;
  bool local_60;
  string uri;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uri._M_dataplus._M_p = (pointer)&uri.field_2;
  uri._M_string_length = 0;
  uri.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&uri,"localhost:8080/rest/headers/someresource.json");
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x12;
  file.m_begin = (iterator)&local_f8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_108,msg);
  _Var2 = uri._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"p1",&local_121);
  GetQueryParameterFromUri
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_80,_Var2._M_p,(string *)local_a0);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_60 ^ 1);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &local_138;
  local_138 = "!GetQueryParameterFromUri(uri.c_str(), \"p1\").has_value()";
  local_130 = "";
  local_c0[8] = false;
  local_c0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
  ;
  local_140 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)local_c0,1,0,WARN,_cVar6,(size_t)&local_148,0x12);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_80);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&uri,"localhost:8080/rest/endpoint/someresource.json?p1=v1");
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x16;
  file_00.m_begin = (iterator)&local_158;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
             msg_00);
  _Var2 = uri._M_dataplus;
  local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
  local_a0._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_90._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
  ;
  local_170 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"p1",(allocator<char> *)&local_120);
  GetQueryParameterFromUri
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_80,_Var2._M_p,(string *)local_c0);
  if (local_60 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    pcVar5 = "v1";
    pvVar4 = (iterator)0x2;
    pvVar3 = local_80;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
              (local_a0,&local_178,0x16,1,2,pvVar3,
               "GetQueryParameterFromUri(uri.c_str(), \"p1\").value()","v1","\"v1\"");
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_80);
    std::__cxx11::string::~string((string *)local_c0);
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
    ;
    local_180 = "";
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x17;
    file_01.m_begin = (iterator)&local_188;
    msg_01.m_end = pvVar3;
    msg_01.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_198,
               msg_01);
    _Var2 = uri._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"p2",&local_121);
    GetQueryParameterFromUri
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_80,_Var2._M_p,(string *)local_a0);
    local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_60 ^ 1);
    local_120.m_message.px = (element_type *)0x0;
    local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_138 = "!GetQueryParameterFromUri(uri.c_str(), \"p2\").has_value()";
    local_130 = "";
    local_c0[8] = false;
    local_c0._0_8_ = &PTR__lazy_ostream_011481f0;
    local_b0 = boost::unit_test::lazy_ostream::inst;
    local_a8 = &local_138;
    local_1a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
    ;
    local_1a0 = "";
    pvVar3 = &DAT_00000001;
    pvVar4 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_120,(lazy_ostream *)local_c0,1,0,WARN,(check_type)pcVar5,(size_t)&local_1a8,
               0x17);
    boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_80);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&uri,"/rest/endpoint/someresource.json?p1=v1&p2=v2");
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
    ;
    local_1b0 = "";
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x1b;
    file_02.m_begin = (iterator)&local_1b8;
    msg_02.m_end = pvVar4;
    msg_02.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1c8,
               msg_02);
    _Var2 = uri._M_dataplus;
    local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
    local_a0._0_8_ = &PTR__lazy_ostream_011480b0;
    aStack_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_90._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_1d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
    ;
    local_1d0 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,"p1",(allocator<char> *)&local_120);
    GetQueryParameterFromUri
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_80,_Var2._M_p,(string *)local_c0);
    if (local_60 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      pvVar4 = (iterator)0x2;
      pvVar3 = local_80;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
                (local_a0,&local_1d8,0x1b,1,2,pvVar3,
                 "GetQueryParameterFromUri(uri.c_str(), \"p1\").value()","v1","\"v1\"");
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_80);
      std::__cxx11::string::~string((string *)local_c0);
      local_1e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
      ;
      local_1e0 = "";
      local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x1c;
      file_03.m_begin = (iterator)&local_1e8;
      msg_03.m_end = pvVar3;
      msg_03.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f8,
                 msg_03);
      _Var2 = uri._M_dataplus;
      local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
      local_a0._0_8_ = &PTR__lazy_ostream_011480b0;
      aStack_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_90._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_208 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
      ;
      local_200 = "";
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_c0,"p2",(allocator<char> *)&local_120);
      GetQueryParameterFromUri
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_80,_Var2._M_p,(string *)local_c0);
      if (local_60 == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        pvVar4 = (iterator)0x2;
        pvVar3 = local_80;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
                  (local_a0,&local_208,0x1c,1,2,pvVar3,
                   "GetQueryParameterFromUri(uri.c_str(), \"p2\").value()","v2","\"v2\"");
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_80);
        std::__cxx11::string::~string((string *)local_c0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&uri,"/rest/endpoint/someresource.json?p1=v1&p1=v2");
        local_218 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
        ;
        local_210 = "";
        local_228 = &boost::unit_test::basic_cstring<char_const>::null;
        local_220 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0x20;
        file_04.m_begin = (iterator)&local_218;
        msg_04.m_end = pvVar3;
        msg_04.m_begin = pvVar4;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_228
                   ,msg_04);
        _Var2 = uri._M_dataplus;
        local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
        local_a0._0_8_ = &PTR__lazy_ostream_011480b0;
        aStack_90._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        aStack_90._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
        local_238 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
        ;
        local_230 = "";
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c0,"p1",(allocator<char> *)&local_120);
        GetQueryParameterFromUri
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_80,_Var2._M_p,(string *)local_c0);
        if (local_60 == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          pcVar5 = "v1";
          pvVar4 = (iterator)0x2;
          pvVar3 = local_80;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
                    (local_a0,&local_238,0x20,1,2,pvVar3,
                     "GetQueryParameterFromUri(uri.c_str(), \"p1\").value()","v1","\"v1\"");
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_80);
          std::__cxx11::string::~string((string *)local_c0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&uri,"/rest/endpoint/someresource.json&p1=v1&p2=v2");
          local_248 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_240 = "";
          local_258 = &boost::unit_test::basic_cstring<char_const>::null;
          local_250 = &boost::unit_test::basic_cstring<char_const>::null;
          file_05.m_end = (iterator)0x24;
          file_05.m_begin = (iterator)&local_248;
          msg_05.m_end = pvVar3;
          msg_05.m_begin = pvVar4;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_258,msg_05);
          _Var2 = uri._M_dataplus;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"p1",&local_121);
          GetQueryParameterFromUri
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_80,_Var2._M_p,(string *)local_a0);
          local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(local_60 ^ 1);
          local_120.m_message.px = (element_type *)0x0;
          local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_138 = "!GetQueryParameterFromUri(uri.c_str(), \"p1\").has_value()";
          local_130 = "";
          local_c0[8] = false;
          local_c0._0_8_ = &PTR__lazy_ostream_011481f0;
          local_b0 = boost::unit_test::lazy_ostream::inst;
          local_a8 = &local_138;
          local_268 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_260 = "";
          pvVar3 = &DAT_00000001;
          pvVar4 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_120,(lazy_ostream *)local_c0,1,0,WARN,(check_type)pcVar5,
                     (size_t)&local_268,0x24);
          boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_80);
          std::__cxx11::string::~string((string *)local_a0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&uri,"/rest/endpoint/someresource.json&p1=v1&p2=v2%");
          local_278 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_270 = "";
          local_288 = &boost::unit_test::basic_cstring<char_const>::null;
          local_280 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = &DAT_00000028;
          file_06.m_begin = (iterator)&local_278;
          msg_06.m_end = pvVar4;
          msg_06.m_begin = pvVar3;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_288,msg_06);
          _Var2 = uri._M_dataplus;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_80,"p1",(allocator<char> *)local_a0);
          GetQueryParameterFromUri
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e8,_Var2._M_p,(string *)local_80);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_e8);
          std::__cxx11::string::~string((string *)local_80);
          local_298 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_290 = "";
          local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_07.m_end = &DAT_00000028;
          file_07.m_begin = (iterator)&local_298;
          msg_07.m_end = pvVar4;
          msg_07.m_begin = pvVar3;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                     (size_t)&local_2a8,msg_07);
          local_a0._0_8_ = local_a0._0_8_ & 0xffffffffffffff00;
          local_a0._8_8_ = (element_type *)0x0;
          aStack_90._M_allocated_capacity = 0;
          local_80[8] = 0;
          local_80._0_8_ = &PTR__lazy_ostream_011489c8;
          local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
          local_68 = "exception std::runtime_error expected but not raised";
          local_2b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/httpserver_tests.cpp"
          ;
          local_2b0 = "";
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_a0,(lazy_ostream *)local_80,1,1,WARN,
                     (check_type)pcVar5,(size_t)&local_2b8,0x28);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_90._M_allocated_capacity);
          std::__cxx11::string::~string((string *)&uri);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            return;
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_query_parameters)
{
    std::string uri {};

    // No parameters
    uri = "localhost:8080/rest/headers/someresource.json";
    BOOST_CHECK(!GetQueryParameterFromUri(uri.c_str(), "p1").has_value());

    // Single parameter
    uri = "localhost:8080/rest/endpoint/someresource.json?p1=v1";
    BOOST_CHECK_EQUAL(GetQueryParameterFromUri(uri.c_str(), "p1").value(), "v1");
    BOOST_CHECK(!GetQueryParameterFromUri(uri.c_str(), "p2").has_value());

    // Multiple parameters
    uri = "/rest/endpoint/someresource.json?p1=v1&p2=v2";
    BOOST_CHECK_EQUAL(GetQueryParameterFromUri(uri.c_str(), "p1").value(), "v1");
    BOOST_CHECK_EQUAL(GetQueryParameterFromUri(uri.c_str(), "p2").value(), "v2");

    // If the query string contains duplicate keys, the first value is returned
    uri = "/rest/endpoint/someresource.json?p1=v1&p1=v2";
    BOOST_CHECK_EQUAL(GetQueryParameterFromUri(uri.c_str(), "p1").value(), "v1");

    // Invalid query string syntax is the same as not having parameters
    uri = "/rest/endpoint/someresource.json&p1=v1&p2=v2";
    BOOST_CHECK(!GetQueryParameterFromUri(uri.c_str(), "p1").has_value());

    // URI with invalid characters (%) raises a runtime error regardless of which query parameter is queried
    uri = "/rest/endpoint/someresource.json&p1=v1&p2=v2%";
    BOOST_CHECK_EXCEPTION(GetQueryParameterFromUri(uri.c_str(), "p1"), std::runtime_error, HasReason("URI parsing failed, it likely contained RFC 3986 invalid characters"));
}